

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftSingleRayCallback::btSoftSingleRayCallback
          (btSoftSingleRayCallback *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          btSoftRigidDynamicsWorld *world,RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  btScalar *pbVar2;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 rayDir;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec8 [16];
  btScalar local_e4;
  btScalar local_bc;
  btScalar local_94;
  btVector3 local_54;
  btVector3 local_44;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btBroadphaseRayCallback::btBroadphaseRayCallback(in_stack_fffffffffffffec8._8_8_);
  *in_RDI = &PTR__btSoftSingleRayCallback_002e8bf8;
  uVar1 = local_10[1];
  in_RDI[5] = *local_10;
  in_RDI[6] = uVar1;
  uVar1 = local_18[1];
  in_RDI[7] = *local_18;
  in_RDI[8] = uVar1;
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x19));
  in_RDI[0x1b] = local_20;
  in_RDI[0x1c] = local_28;
  btTransform::setIdentity(in_stack_fffffffffffffec8._8_8_);
  btTransform::setOrigin((btTransform *)(in_RDI + 9),(btVector3 *)(in_RDI + 5));
  btTransform::setIdentity(in_stack_fffffffffffffec8._8_8_);
  btTransform::setOrigin((btTransform *)(in_RDI + 0x11),(btVector3 *)(in_RDI + 7));
  bVar4 = operator-(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_);
  local_44.m_floats._8_8_ = bVar4.m_floats._8_8_;
  local_44.m_floats._0_8_ = bVar4.m_floats._0_8_;
  btVector3::normalize((btVector3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  pbVar2 = btVector3::operator_cast_to_float_(&local_44);
  if ((*pbVar2 != 0.0) || (NAN(*pbVar2))) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_44);
    local_94 = 1.0 / *pbVar2;
  }
  else {
    local_94 = 1e+30;
  }
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *pbVar2 = local_94;
  pbVar2 = btVector3::operator_cast_to_float_(&local_44);
  if ((pbVar2[1] != 0.0) || (NAN(pbVar2[1]))) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_44);
    local_bc = 1.0 / pbVar2[1];
  }
  else {
    local_bc = 1e+30;
  }
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  pbVar2[1] = local_bc;
  pbVar2 = btVector3::operator_cast_to_float_(&local_44);
  if ((pbVar2[2] != 0.0) || (NAN(pbVar2[2]))) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_44);
    local_e4 = 1.0 / pbVar2[2];
  }
  else {
    local_e4 = 1e+30;
  }
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  pbVar2[2] = local_e4;
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)(in_RDI + 3) = (uint)(*pbVar2 < 0.0);
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)((long)in_RDI + 0x1c) = (uint)(pbVar2[1] < 0.0);
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  *(uint *)(in_RDI + 4) = (uint)(pbVar2[2] < 0.0);
  bVar4 = operator-(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_);
  local_54.m_floats._8_8_ = bVar4.m_floats._8_8_;
  local_54.m_floats._0_8_ = bVar4.m_floats._0_8_;
  bVar3 = btVector3::dot(&local_44,&local_54);
  *(btScalar *)((long)in_RDI + 0x24) = bVar3;
  return;
}

Assistant:

btSoftSingleRayCallback(const btVector3& rayFromWorld,const btVector3& rayToWorld,const btSoftRigidDynamicsWorld* world,btCollisionWorld::RayResultCallback& resultCallback)
	:m_rayFromWorld(rayFromWorld),
	m_rayToWorld(rayToWorld),
	m_world(world),
	m_resultCallback(resultCallback)
	{
		m_rayFromTrans.setIdentity();
		m_rayFromTrans.setOrigin(m_rayFromWorld);
		m_rayToTrans.setIdentity();
		m_rayToTrans.setOrigin(m_rayToWorld);

		btVector3 rayDir = (rayToWorld-rayFromWorld);

		rayDir.normalize ();
		///what about division by zero? --> just set rayDirection[i] to INF/1e30
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(m_rayToWorld-m_rayFromWorld);

	}